

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.h
# Opt level: O3

bool asmjit::CodeWriterUtils::encodeOffset32(uint32_t *dst,int64_t offset64,OffsetFormat *format)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  ulong extraout_RAX;
  char *extraout_RDX;
  OffsetFormat *format_00;
  uint uVar4;
  uint32_t uVar5;
  ulong uVar6;
  ulong uStack_28;
  
  bVar1 = format->_immBitCount;
  if ((bVar1 == 0) || ((uint)format->_valueSize * 8 < (uint)bVar1)) {
    return false;
  }
  bVar2 = format->_immDiscardLsb;
  if (bVar2 != 0) {
    if (0x20 < bVar2) {
      encodeOffset32();
      bVar1 = extraout_RDX[5];
      if ((bVar1 != 0) && ((uint)bVar1 <= (uint)(byte)extraout_RDX[3] << 3)) {
        bVar2 = extraout_RDX[7];
        if (bVar2 != 0) {
          if (0x20 < bVar2) {
            encodeOffset64();
            bVar3 = false;
            if (format_00->_valueSize - 1 < 8) {
              uVar6 = (ulong)format_00->_valueOffset;
              bVar3 = false;
              uStack_28 = extraout_RAX;
              switch((uint)format_00->_valueSize) {
              case 1:
                bVar3 = encodeOffset32((uint32_t *)&uStack_28,offset64,format_00);
                if (bVar3) {
                  *(byte *)((long)dst + uVar6) = *(byte *)((long)dst + uVar6) | (byte)uStack_28;
                }
                break;
              case 2:
                bVar3 = encodeOffset32((uint32_t *)&uStack_28,offset64,format_00);
                if (bVar3) {
                  *(ushort *)((long)dst + uVar6) =
                       *(ushort *)((long)dst + uVar6) | (ushort)uStack_28;
                }
                break;
              case 4:
                bVar3 = encodeOffset32((uint32_t *)&uStack_28,offset64,format_00);
                if (bVar3) {
                  *(uint *)((long)dst + uVar6) = *(uint *)((long)dst + uVar6) | (uint)uStack_28;
                }
                break;
              case 8:
                bVar3 = encodeOffset64(&uStack_28,offset64,format_00);
                if (bVar3) {
                  *(ulong *)((long)dst + uVar6) = *(ulong *)((long)dst + uVar6) | uStack_28;
                }
              }
            }
            return bVar3;
          }
          if (((~(uint)(-1L << (bVar2 & 0x3f)) | 1) & (uint)offset64) != 0) {
            return false;
          }
          offset64 = offset64 >> (bVar2 & 0x3f);
        }
        if (((offset64 << (-bVar1 & 0x3f)) >> (-bVar1 & 0x3f) == offset64) &&
           (*extraout_RDX == '\0')) {
          *(ulong *)dst =
               ((ulong)(offset64 << (-bVar1 & 0x3f)) >> (-bVar1 & 0x3f)) <<
               (extraout_RDX[6] & 0x3fU);
          return true;
        }
      }
      return false;
    }
    if (((~(uint)(-1L << (bVar2 & 0x3f)) | 1) & (uint)offset64) != 0) {
      return false;
    }
    offset64 = offset64 >> (bVar2 & 0x3f);
  }
  uVar4 = (uint)offset64;
  if ((int)uVar4 != offset64) {
    return false;
  }
  if ((int)(uVar4 << (-bVar1 & 0x1f)) >> (-bVar1 & 0x1f) == uVar4) {
    if (format->_type - 1 < 2) {
      if (format->_immBitShift != 5) {
        return false;
      }
      if (bVar1 != 0x15) {
        return false;
      }
      if (format->_valueSize != 4) {
        return false;
      }
      uVar5 = (uVar4 & 3) * 0x20000000 + (uVar4 & 0x1ffffc) * 8;
    }
    else {
      if (format->_type != 0) {
        return false;
      }
      uVar5 = (uVar4 & ~(uint)(-1L << (bVar1 & 0x3f))) << (format->_immBitShift & 0x1f);
    }
    *dst = uVar5;
    return true;
  }
  return false;
}

Assistant:

inline uint32_t immBitCount() const noexcept { return _immBitCount; }